

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::DomeLight>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,DomeLight *light,
               string *warn,string *err,PrimReconstructOptions *options)

{
  _Base_ptr __lhs;
  Property *prop;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  ostream *poVar5;
  size_type sVar6;
  mapped_type *this;
  _Base_ptr p_Var7;
  char *pcVar8;
  string *psVar9;
  int iVar10;
  allocator local_3a9;
  string *local_3a8;
  ParseResult ret;
  string local_368;
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_348;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_340;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  ostringstream ss_e;
  code *local_298 [45];
  _Any_data local_130;
  code *local_120;
  _Any_data local_110;
  code *local_100;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = ReconstructXformOpsFromProperties
                    (spec,&table,properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)light,err);
  if (bVar2) {
    p_Var7 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_348 = &(light->super_NonboundableLight).purpose;
    local_340 = &(light->super_NonboundableLight).visibility;
    local_3a8 = err;
    while( true ) {
      bVar2 = (_Rb_tree_header *)p_Var7 == &(properties->_M_t)._M_impl.super__Rb_tree_header;
      if (bVar2) break;
      __lhs = p_Var7 + 1;
      ::std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
      prop = (Property *)(p_Var7 + 2);
      ::std::__cxx11::string::string((string *)&ss_e,"guideRadius",(allocator *)&local_368);
      psVar9 = (string *)&ss_e;
      anon_unknown_0::ParseTypedAttribute<float>
                (&ret,&table,&local_50,prop,(string *)&ss_e,&light->guideRadius);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      iVar10 = 0;
      if ((ret.code & ~AlreadyProcessed) == Success) {
        iVar10 = 3;
LAB_001c319c:
        bVar3 = false;
      }
      else {
        bVar3 = true;
        if (ret.code != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar5 = ::std::operator<<(poVar5,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar5 = ::std::operator<<(poVar5,":");
          poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
          poVar5 = ::std::operator<<(poVar5,"():");
          poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xd3e);
          ::std::operator<<(poVar5," ");
          ::std::__cxx11::string::string
                    ((string *)&local_2c8,"Parsing attribute `{}` failed. Error: {}",&local_3a9);
          fmt::format<char[12],std::__cxx11::string>
                    (&local_368,(fmt *)&local_2c8,(string *)0x3419af,(char (*) [12])&ret.err,psVar9)
          ;
          poVar5 = ::std::operator<<((ostream *)&ss_e,(string *)&local_368);
          ::std::operator<<(poVar5,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          psVar9 = local_3a8;
          if (local_3a8 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_368,&local_2c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar9);
            ::std::__cxx11::string::operator=((string *)psVar9,(string *)&local_368);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          iVar10 = 1;
          goto LAB_001c319c;
        }
      }
      ::std::__cxx11::string::_M_dispose();
      if (bVar3) {
        ::std::__cxx11::string::string((string *)&local_70,(string *)__lhs);
        ::std::__cxx11::string::string((string *)&ss_e,"inputs:diffuse",(allocator *)&local_368);
        psVar9 = (string *)&ss_e;
        anon_unknown_0::ParseTypedAttribute<float>
                  (&ret,&table,&local_70,prop,(string *)&ss_e,
                   &(light->super_NonboundableLight).diffuse);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar10 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          iVar10 = 3;
LAB_001c335c:
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xd3f);
            ::std::operator<<(poVar5," ");
            ::std::__cxx11::string::string
                      ((string *)&local_2c8,"Parsing attribute `{}` failed. Error: {}",&local_3a9);
            fmt::format<char[15],std::__cxx11::string>
                      (&local_368,(fmt *)&local_2c8,(string *)"inputs:diffuse",
                       (char (*) [15])&ret.err,psVar9);
            poVar5 = ::std::operator<<((ostream *)&ss_e,(string *)&local_368);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar9 = local_3a8;
            if (local_3a8 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_368,&local_2c8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar9);
              ::std::__cxx11::string::operator=((string *)psVar9,(string *)&local_368);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            iVar10 = 1;
            goto LAB_001c335c;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar3) goto LAB_001c418c;
        ::std::__cxx11::string::string((string *)&local_90,(string *)__lhs);
        ::std::__cxx11::string::string((string *)&ss_e,"inputs:specular",(allocator *)&local_368);
        psVar9 = (string *)&ss_e;
        anon_unknown_0::ParseTypedAttribute<float>
                  (&ret,&table,&local_90,prop,(string *)&ss_e,
                   &(light->super_NonboundableLight).specular);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar10 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          iVar10 = 3;
LAB_001c351c:
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xd41);
            ::std::operator<<(poVar5," ");
            ::std::__cxx11::string::string
                      ((string *)&local_2c8,"Parsing attribute `{}` failed. Error: {}",&local_3a9);
            fmt::format<char[16],std::__cxx11::string>
                      (&local_368,(fmt *)&local_2c8,(string *)"inputs:specular",
                       (char (*) [16])&ret.err,psVar9);
            poVar5 = ::std::operator<<((ostream *)&ss_e,(string *)&local_368);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar9 = local_3a8;
            if (local_3a8 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_368,&local_2c8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar9);
              ::std::__cxx11::string::operator=((string *)psVar9,(string *)&local_368);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            iVar10 = 1;
            goto LAB_001c351c;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar3) goto LAB_001c418c;
        ::std::__cxx11::string::string((string *)&local_b0,(string *)__lhs);
        ::std::__cxx11::string::string
                  ((string *)&ss_e,"inputs:colorTemperature",(allocator *)&local_368);
        psVar9 = (string *)&ss_e;
        anon_unknown_0::ParseTypedAttribute<float>
                  (&ret,&table,&local_b0,prop,(string *)&ss_e,
                   &(light->super_NonboundableLight).colorTemperature);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar10 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          iVar10 = 3;
LAB_001c36dc:
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xd43);
            ::std::operator<<(poVar5," ");
            ::std::__cxx11::string::string
                      ((string *)&local_2c8,"Parsing attribute `{}` failed. Error: {}",&local_3a9);
            fmt::format<char[24],std::__cxx11::string>
                      (&local_368,(fmt *)&local_2c8,(string *)"inputs:colorTemperature",
                       (char (*) [24])&ret.err,psVar9);
            poVar5 = ::std::operator<<((ostream *)&ss_e,(string *)&local_368);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar9 = local_3a8;
            if (local_3a8 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_368,&local_2c8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar9);
              ::std::__cxx11::string::operator=((string *)psVar9,(string *)&local_368);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            iVar10 = 1;
            goto LAB_001c36dc;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar3) goto LAB_001c418c;
        ::std::__cxx11::string::string((string *)&local_d0,(string *)__lhs);
        ::std::__cxx11::string::string((string *)&ss_e,"inputs:color",(allocator *)&local_368);
        psVar9 = (string *)&ss_e;
        anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
                  (&ret,&table,&local_d0,prop,(string *)&ss_e,
                   &(light->super_NonboundableLight).color);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar10 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          iVar10 = 3;
LAB_001c389c:
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xd44);
            ::std::operator<<(poVar5," ");
            ::std::__cxx11::string::string
                      ((string *)&local_2c8,"Parsing attribute `{}` failed. Error: {}",&local_3a9);
            fmt::format<char[13],std::__cxx11::string>
                      (&local_368,(fmt *)&local_2c8,(string *)"inputs:color",(char (*) [13])&ret.err
                       ,psVar9);
            poVar5 = ::std::operator<<((ostream *)&ss_e,(string *)&local_368);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar9 = local_3a8;
            if (local_3a8 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_368,&local_2c8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar9);
              ::std::__cxx11::string::operator=((string *)psVar9,(string *)&local_368);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            iVar10 = 1;
            goto LAB_001c389c;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar3) goto LAB_001c418c;
        ::std::__cxx11::string::string((string *)&local_f0,(string *)__lhs);
        ::std::__cxx11::string::string((string *)&ss_e,"inputs:intensity",(allocator *)&local_368);
        psVar9 = (string *)&ss_e;
        anon_unknown_0::ParseTypedAttribute<float>
                  (&ret,&table,&local_f0,prop,(string *)&ss_e,
                   &(light->super_NonboundableLight).intensity);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar10 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          iVar10 = 3;
LAB_001c3a5c:
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar5 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar5 = ::std::operator<<(poVar5,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar5 = ::std::operator<<(poVar5,":");
            poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
            poVar5 = ::std::operator<<(poVar5,"():");
            poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xd46);
            ::std::operator<<(poVar5," ");
            ::std::__cxx11::string::string
                      ((string *)&local_2c8,"Parsing attribute `{}` failed. Error: {}",&local_3a9);
            fmt::format<char[17],std::__cxx11::string>
                      (&local_368,(fmt *)&local_2c8,(string *)"inputs:intensity",
                       (char (*) [17])&ret.err,psVar9);
            poVar5 = ::std::operator<<((ostream *)&ss_e,(string *)&local_368);
            ::std::operator<<(poVar5,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            psVar9 = local_3a8;
            if (local_3a8 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_368,&local_2c8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar9);
              ::std::__cxx11::string::operator=((string *)psVar9,(string *)&local_368);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            iVar10 = 1;
            goto LAB_001c3a5c;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar3) goto LAB_001c418c;
        bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs,"visibility");
        if (bVar3) {
          ::std::__cxx11::string::string((string *)&ss_e,"visibility",(allocator *)&ret);
          sVar6 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&table,(string *)&ss_e);
          ::std::__cxx11::string::_M_dispose();
          if (sVar6 == 0) {
            Property::value_type_name_abi_cxx11_((string *)&ss_e,prop);
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var4 = ::std::operator==((string *)&ss_e,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret);
            if ((_Var4) && (uVar1 = *(uint *)((long)&p_Var7[0x17]._M_parent + 4), uVar1 < 2)) {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (uVar1 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar5 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                poVar5 = ::std::operator<<(poVar5,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar5 = ::std::operator<<(poVar5,":");
                poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
                poVar5 = ::std::operator<<(poVar5,"():");
                poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xd48);
                ::std::operator<<(poVar5," ");
                poVar5 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                poVar5 = ::std::operator<<(poVar5,"visibility");
                poVar5 = ::std::operator<<(poVar5,"` token attribute. Set default token value.");
                ::std::operator<<(poVar5,"\n");
                if (warn != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_368,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_3a8);
                  ::std::__cxx11::string::operator=((string *)warn,(string *)&ret);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                AttrMetas::operator=(&local_340->_metas,(AttrMetas *)(p_Var7 + 7));
                pcVar8 = "visibility";
LAB_001c3def:
                ::std::__cxx11::string::string((string *)&ss_e,pcVar8,(allocator *)&ret);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&table,(string *)&ss_e);
                ::std::__cxx11::string::_M_dispose();
                goto LAB_001c4197;
              }
            }
            else {
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            _ss_e = VisibilityEnumHandler;
            local_298[0] = ::std::
                           _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           ::_M_manager;
            ::std::__cxx11::string::string((string *)&ret,"visibility",(allocator *)&local_368);
            bVar3 = options->strict_allowedToken_check;
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function((function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_110,
                       (function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&ss_e);
            bVar3 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                              ((string *)&ret,bVar3,
                               (EnumHandlerFun<tinyusdz::Visibility> *)&local_110,(Attribute *)prop,
                               local_340,warn,local_3a8);
            if (local_100 != (code *)0x0) {
              (*local_100)(&local_110,&local_110,__destroy_functor);
            }
            ::std::__cxx11::string::_M_dispose();
            iVar10 = 1;
            if (bVar3) {
              AttrMetas::operator=(&local_340->_metas,(AttrMetas *)(p_Var7 + 7));
              pcVar8 = "visibility";
LAB_001c414e:
              ::std::__cxx11::string::string((string *)&ret,pcVar8,(allocator *)&local_368);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret);
              ::std::__cxx11::string::_M_dispose();
              iVar10 = 3;
            }
LAB_001c4174:
            if (local_298[0] != (code *)0x0) {
              (*local_298[0])((string *)&ss_e,(string *)&ss_e,3);
            }
            goto LAB_001c418c;
          }
        }
        else {
          bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"purpose");
          if (bVar3) {
            ::std::__cxx11::string::string((string *)&ss_e,"purpose",(allocator *)&ret);
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(string *)&ss_e);
            ::std::__cxx11::string::_M_dispose();
            if (sVar6 == 0) {
              Property::value_type_name_abi_cxx11_((string *)&ss_e,prop);
              tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
              _Var4 = ::std::operator==((string *)&ss_e,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&ret);
              if ((_Var4) && (uVar1 = *(uint *)((long)&p_Var7[0x17]._M_parent + 4), uVar1 < 2)) {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                if (uVar1 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar5 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                  poVar5 = ::std::operator<<(poVar5,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                            );
                  poVar5 = ::std::operator<<(poVar5,":");
                  poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
                  poVar5 = ::std::operator<<(poVar5,"():");
                  poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xd4a);
                  ::std::operator<<(poVar5," ");
                  poVar5 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                  poVar5 = ::std::operator<<(poVar5,"purpose");
                  poVar5 = ::std::operator<<(poVar5,"` token attribute. Set default token value.");
                  ::std::operator<<(poVar5,"\n");
                  if (warn != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&local_368,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_3a8);
                    ::std::__cxx11::string::operator=((string *)warn,(string *)&ret);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                  AttrMetas::operator=(&local_348->_metas,(AttrMetas *)(p_Var7 + 7));
                  pcVar8 = "purpose";
                  goto LAB_001c3def;
                }
              }
              else {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              _ss_e = PurposeEnumHandler;
              local_298[0] = ::std::
                             _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             ::_M_manager;
              ::std::__cxx11::string::string((string *)&ret,"purpose",(allocator *)&local_368);
              bVar3 = options->strict_allowedToken_check;
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function((function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&local_130,
                         (function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&ss_e);
              bVar3 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                ((string *)&ret,bVar3,
                                 (EnumHandlerFun<tinyusdz::Purpose> *)&local_130,(Attribute *)prop,
                                 local_348,warn,local_3a8);
              if (local_120 != (code *)0x0) {
                (*local_120)(&local_130,&local_130,__destroy_functor);
              }
              ::std::__cxx11::string::_M_dispose();
              iVar10 = 1;
              if (bVar3) {
                AttrMetas::operator=(&local_348->_metas,(AttrMetas *)(p_Var7 + 7));
                pcVar8 = "purpose";
                goto LAB_001c414e;
              }
              goto LAB_001c4174;
            }
          }
          else {
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)__lhs);
            if (sVar6 == 0) {
              this = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     ::operator[](&(light->super_NonboundableLight).props,(key_type *)__lhs);
              Property::operator=(this,prop);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs)
              ;
            }
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&table,(key_type *)__lhs);
            if (sVar6 == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar5 = ::std::operator<<((ostream *)&ss_e,"[warn]");
              poVar5 = ::std::operator<<(poVar5,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar5 = ::std::operator<<(poVar5,":");
              poVar5 = ::std::operator<<(poVar5,"ReconstructPrim");
              poVar5 = ::std::operator<<(poVar5,"():");
              poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0xd4c);
              ::std::operator<<(poVar5," ");
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret,"Unsupported/unimplemented property: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __lhs);
              poVar5 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
              ::std::operator<<(poVar5,"\n");
              ::std::__cxx11::string::_M_dispose();
              if (warn != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&local_368,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_3a8);
                ::std::__cxx11::string::operator=((string *)warn,(string *)&ret);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            }
          }
        }
      }
      else {
LAB_001c418c:
        if ((iVar10 != 3) && (iVar10 != 0)) break;
      }
LAB_001c4197:
      p_Var7 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7);
    }
  }
  else {
    bVar2 = false;
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return bVar2;
}

Assistant:

bool ReconstructPrim<DomeLight>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    DomeLight *light,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;

  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &light->xformOps, err)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "guideRadius", DomeLight, light->guideRadius)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:diffuse", DomeLight, light->diffuse)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:specular", DomeLight,
                   light->specular)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:colorTemperature", DomeLight,
                   light->colorTemperature)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:color", DomeLight, light->color)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:intensity", DomeLight,
                   light->intensity)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, DomeLight,
                   light->visibility, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, DomeLight,
                       light->purpose, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, DomeLight, light->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  DCOUT("Implement DomeLight");
  return true;
}